

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::update(QGraphicsScene *this,QRectF *rect)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  QGraphicsView *this_00;
  QGraphicsViewPrivate *this_01;
  char cVar7;
  bool bVar8;
  long lVar9;
  QRect *r;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  QRectF local_b8;
  QRect local_98;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(this + 8);
  if ((*(byte *)(lVar4 + 0xb8) & 4) == 0) {
    dVar2 = rect->w;
    dVar3 = rect->h;
    if (((0.0 < dVar2) && (0.0 < dVar3)) ||
       ((dVar2 == 0.0 && (((!NAN(dVar2) && (dVar3 == 0.0)) && (!NAN(dVar3))))))) {
      cVar7 = QObjectPrivate::isSignalConnected((uint)lVar4,SUB41(*(undefined4 *)(lVar4 + 0x78),0));
      if (cVar7 == '\0') {
        bVar8 = *(long *)(lVar4 + 0x290) != 0;
      }
      else {
        bVar8 = false;
      }
      if (((rect->w != 0.0) || (NAN(rect->w))) || ((rect->h != 0.0 || (NAN(rect->h))))) {
        if (bVar8) {
          lVar5 = *(long *)(lVar4 + 0x290);
          if (lVar5 != 0) {
            lVar6 = *(long *)(lVar4 + 0x288);
            lVar9 = 0;
            do {
              this_00 = *(QGraphicsView **)(lVar6 + lVar9);
              bVar8 = QGraphicsView::isTransformed(this_00);
              this_01 = *(QGraphicsViewPrivate **)(this_00 + 8);
              if (bVar8) {
                QGraphicsView::viewportTransform(&local_88,this_00);
                QTransform::mapRect(&local_b8);
                if ((0.0 < local_b8.w) && (0.0 < local_b8.h)) {
                  if (((this_01->optimizationFlags).
                       super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
                       super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
                    auVar12 = QRectF::toAlignedRect();
                    auVar10._12_4_ = auVar12._12_4_;
                    auVar10._0_4_ = (undefined4)(auVar12._0_8_ + 0xfffffffe);
                    auVar10._8_4_ = (undefined4)(auVar12._8_8_ + 2);
                    auVar10._4_4_ = auVar10._8_4_;
                    local_98._0_8_ = CONCAT44(auVar12._4_4_,auVar10._0_4_) + -0x200000000;
                    local_98._8_8_ = auVar10._8_8_ + 0x200000000;
                  }
                  else {
                    auVar12 = QRectF::toAlignedRect();
                    auVar11._12_4_ = auVar12._12_4_;
                    auVar11._0_4_ = (undefined4)(auVar12._0_8_ + 0xffffffff);
                    auVar11._8_4_ = (undefined4)(auVar12._8_8_ + 1);
                    auVar11._4_4_ = auVar11._8_4_;
                    local_98._0_8_ = CONCAT44(auVar12._4_4_,auVar11._0_4_) + -0x100000000;
                    local_98._8_8_ = auVar11._8_8_ + 0x100000000;
                  }
                  r = &local_98;
LAB_0060b016:
                  QGraphicsViewPrivate::updateRect(this_01,r);
                }
              }
              else if ((0.0 < rect->w) && (0.0 < rect->h)) {
                if (((this_01->optimizationFlags).
                     super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
                     super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
                  auVar12 = QRectF::toAlignedRect();
                  auVar13._12_4_ = auVar12._12_4_;
                  auVar13._0_4_ = (undefined4)(auVar12._0_8_ + 0xfffffffe);
                  auVar13._8_4_ = (undefined4)(auVar12._8_8_ + 2);
                  auVar13._4_4_ = auVar13._8_4_;
                  local_88.m_matrix[0][0] =
                       (qreal)(CONCAT44(auVar12._4_4_,auVar13._0_4_) + -0x200000000);
                  local_88.m_matrix[0][1] = (qreal)(auVar13._8_8_ + 0x200000000);
                }
                else {
                  auVar13 = QRectF::toAlignedRect();
                  auVar12._12_4_ = auVar13._12_4_;
                  auVar12._0_4_ = (undefined4)(auVar13._0_8_ + 0xffffffff);
                  auVar12._8_4_ = (undefined4)(auVar13._8_8_ + 1);
                  auVar12._4_4_ = auVar12._8_4_;
                  local_88.m_matrix[0][0] =
                       (qreal)(CONCAT44(auVar13._4_4_,auVar12._0_4_) + -0x100000000);
                  local_88.m_matrix[0][1] = (qreal)(auVar12._8_8_ + 0x100000000);
                }
                r = (QRect *)&local_88;
                goto LAB_0060b016;
              }
              lVar9 = lVar9 + 8;
            } while (lVar5 << 3 != lVar9);
          }
        }
        else {
          std::
          _Rb_tree<QRectF,QRectF,std::_Identity<QRectF>,QGraphicsScenePrivate::UpdatedRectsCmp,std::allocator<QRectF>>
          ::_M_insert_unique<QRectF_const&>
                    ((_Rb_tree<QRectF,QRectF,std::_Identity<QRectF>,QGraphicsScenePrivate::UpdatedRectsCmp,std::allocator<QRectF>>
                      *)(lVar4 + 0xe8),rect);
        }
      }
      else {
        *(byte *)(lVar4 + 0xb8) = *(byte *)(lVar4 + 0xb8) | 4;
        std::
        _Rb_tree<QRectF,_QRectF,_std::_Identity<QRectF>,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_>
        ::_M_erase((_Rb_tree<QRectF,_QRectF,_std::_Identity<QRectF>,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_>
                    *)(lVar4 + 0xe8),*(_Link_type *)(lVar4 + 0xf8));
        *(undefined8 *)(lVar4 + 0xf8) = 0;
        *(long *)(lVar4 + 0x100) = lVar4 + 0xf0;
        *(long *)(lVar4 + 0x108) = lVar4 + 0xf0;
        *(undefined8 *)(lVar4 + 0x110) = 0;
        if ((bVar8) && (lVar5 = *(long *)(lVar4 + 0x290), lVar5 != 0)) {
          lVar6 = *(long *)(lVar4 + 0x288);
          lVar9 = 0;
          do {
            puVar1 = (uint *)(*(long *)(*(long *)(lVar6 + lVar9) + 8) + 0x300);
            *puVar1 = *puVar1 | 0x1000;
            lVar9 = lVar9 + 8;
          } while (lVar5 << 3 != lVar9);
        }
      }
      if ((*(uint *)(lVar4 + 0xb8) & 8) == 0) {
        *(uint *)(lVar4 + 0xb8) = *(uint *)(lVar4 + 0xb8) | 8;
        local_88.m_matrix[0][0] = 0.0;
        local_88.m_matrix[0][1] = 0.0;
        local_88.m_matrix[0][2] = 0.0;
        QMetaObject::invokeMethodImpl
                  ((QObject *)this,"_q_emitUpdated",QueuedConnection,1,(void **)&local_88,
                   (char **)(local_88.m_matrix[0] + 1),
                   (QMetaTypeInterface **)(local_88.m_matrix[0] + 2));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::update(const QRectF &rect)
{
    Q_D(QGraphicsScene);
    if (d->updateAll || (rect.isEmpty() && !rect.isNull()))
        return;

    // Check if anyone's connected; if not, we can send updates directly to
    // the views. Otherwise or if there are no views, use old behavior.
    bool directUpdates = !(d->isSignalConnected(d->changedSignalIndex)) && !d->views.isEmpty();
    if (rect.isNull()) {
        d->updateAll = true;
        d->updatedRects.clear();
        if (directUpdates) {
            // Update all views.
            for (auto view : std::as_const(d->views))
                view->d_func()->fullUpdatePending = true;
        }
    } else {
        if (directUpdates) {
            // Update all views.
            for (auto view : std::as_const(d->views)) {
                if (view->isTransformed())
                    view->d_func()->updateRectF(view->viewportTransform().mapRect(rect));
                else
                    view->d_func()->updateRectF(rect);
            }
        } else {
            d->updatedRects.insert(rect);
        }
    }

    if (!d->calledEmitUpdated) {
        d->calledEmitUpdated = true;
        QMetaObject::invokeMethod(this, "_q_emitUpdated", Qt::QueuedConnection);
    }
}